

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiBufferViewAccessTests.cpp
# Opt level: O3

TestCaseGroup * vkt::api::createBufferViewAccessTests(TestContext *testCtx)

{
  TestNode *this;
  ostream *poVar1;
  TestNode *pTVar2;
  ostringstream description;
  long *local_1e8 [2];
  long local_1d8 [2];
  long *local_1c8;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  this = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,testCtx,"access","BufferView Access Tests");
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"bufferSize: ",0xc);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," bufferViewSize: ",0x11);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," bufferView element offset: ",0x1c);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  pTVar2 = (TestNode *)operator_new(0x80);
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e8,"buffer_view_memory_test_complete","");
  std::__cxx11::stringbuf::str();
  tcu::TestCase::TestCase((TestCase *)pTVar2,testCtx,(char *)local_1e8[0],(char *)local_1c8);
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00cef7b0;
  pTVar2[1]._vptr_TestNode = (_func_int **)0x20000000200;
  *(undefined4 *)&pTVar2[1].m_testCtx = 0;
  tcu::TestNode::addChild(this,pTVar2);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  if (local_1e8[0] != local_1d8) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"bufferSize: ",0xc);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," bufferViewSize: ",0x11);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," bufferView element offset: ",0x1c);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  pTVar2 = (TestNode *)operator_new(0x80);
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e8,"buffer_view_memory_test_partial_offset0","");
  std::__cxx11::stringbuf::str();
  tcu::TestCase::TestCase((TestCase *)pTVar2,testCtx,(char *)local_1e8[0],(char *)local_1c8);
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00cef7b0;
  pTVar2[1]._vptr_TestNode = (_func_int **)0x20000001000;
  *(undefined4 *)&pTVar2[1].m_testCtx = 0;
  tcu::TestNode::addChild(this,pTVar2);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  if (local_1e8[0] != local_1d8) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"bufferSize: ",0xc);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," bufferViewSize: ",0x11);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," bufferView element offset: ",0x1c);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  pTVar2 = (TestNode *)operator_new(0x80);
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e8,"buffer_view_memory_test_partial_offset1","");
  std::__cxx11::stringbuf::str();
  tcu::TestCase::TestCase((TestCase *)pTVar2,testCtx,(char *)local_1e8[0],(char *)local_1c8);
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00cef7b0;
  pTVar2[1]._vptr_TestNode = (_func_int **)0x20000001000;
  *(undefined4 *)&pTVar2[1].m_testCtx = 0x80;
  tcu::TestNode::addChild(this,pTVar2);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  if (local_1e8[0] != local_1d8) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return (TestCaseGroup *)this;
}

Assistant:

tcu::TestCaseGroup* createBufferViewAccessTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup>	bufferViewTests	(new tcu::TestCaseGroup(testCtx, "access", "BufferView Access Tests"));

	{
		BufferViewCaseParams info =
		{
			512,	// deUint32	bufferSize
			512,	// deUint32	bufferViewSize
			0,		// deUint32	elementOffset
		};
		std::ostringstream description;
		description << "bufferSize: " << info.bufferSize << " bufferViewSize: " << info.bufferViewSize << " bufferView element offset: " << info.elementOffset;
		bufferViewTests->addChild(new BufferViewTestCase(testCtx, "buffer_view_memory_test_complete", description.str(), info));
	}

	{
		BufferViewCaseParams info =
		{
			4096,	// deUint32	bufferSize
			512,	// deUint32	bufferViewSize
			0,		// deUint32	elementOffset
		};
		std::ostringstream description;
		description << "bufferSize: " << info.bufferSize << " bufferViewSize: " << info.bufferViewSize << " bufferView element offset: " << info.elementOffset;
		bufferViewTests->addChild(new BufferViewTestCase(testCtx, "buffer_view_memory_test_partial_offset0", description.str(), info));
	}

	{
		BufferViewCaseParams info =
		{
			4096,	// deUint32	bufferSize
			512,	// deUint32	bufferViewSize
			128,	// deUint32	elementOffset
		};
		std::ostringstream description;
		description << "bufferSize: " << info.bufferSize << " bufferViewSize: " << info.bufferViewSize << " bufferView element offset: " << info.elementOffset;
		bufferViewTests->addChild(new BufferViewTestCase(testCtx, "buffer_view_memory_test_partial_offset1", description.str(), info));
	}

	return bufferViewTests.release();
}